

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraintTwoGenericBoxed.cpp
# Opt level: O1

ChConstraintTwoGenericBoxed * __thiscall
chrono::ChConstraintTwoGenericBoxed::operator=
          (ChConstraintTwoGenericBoxed *this,ChConstraintTwoGenericBoxed *other)

{
  if (other != this) {
    ChConstraintTwoGeneric::operator=
              (&this->super_ChConstraintTwoGeneric,&other->super_ChConstraintTwoGeneric);
    this->l_min = other->l_min;
    this->l_max = other->l_max;
  }
  return this;
}

Assistant:

ChConstraintTwoGenericBoxed& ChConstraintTwoGenericBoxed::operator=(const ChConstraintTwoGenericBoxed& other) {
    if (&other == this)
        return *this;

    // copy parent class data
    ChConstraintTwoGeneric::operator=(other);

    l_min = other.l_min;
    l_max = other.l_max;

    return *this;
}